

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O1

Abc_Obj_t * Lpk_Implement_rec(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *pFun)

{
  char cVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  
  if ((*(ushort *)&pFun->field_0x8 & 0xf80) != 0) {
    uVar4 = 0;
    do {
      cVar1 = pFun->pFanins[uVar4];
      if ((cVar1 < '\0') || (vLeaves->nSize <= (int)cVar1)) {
LAB_004dadb0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((ulong)vLeaves->pArray[(uint)(int)cVar1] & 1) == 0) {
        Lpk_Implement_rec(pMan,pNtk,vLeaves,(Lpk_Fun_t *)vLeaves->pArray[(uint)(int)cVar1]);
      }
      cVar1 = pFun->pFanins[uVar4];
      if ((cVar1 < '\0') || (vLeaves->nSize <= (int)cVar1)) goto LAB_004dadb0;
      if (((ulong)vLeaves->pArray[(uint)(int)cVar1] & 1) == 0) {
        __assert_fail("Abc_ObjIsComplement(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDec.c"
                      ,99,
                      "Abc_Obj_t *Lpk_Implement_rec(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, Lpk_Fun_t *)"
                     );
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (*(uint *)&pFun->field_0x8 >> 7 & 0x1f));
  }
  pAVar3 = Lpk_ImplementFun(pMan,pNtk,vLeaves,pFun);
  uVar2 = *(uint *)&pFun->field_0x8 & 0x7f;
  if ((int)uVar2 < vLeaves->nSize) {
    vLeaves->pArray[uVar2] = (void *)((ulong)pAVar3 ^ 1);
    Lpk_FunFree(pFun);
    return pAVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

Abc_Obj_t * Lpk_Implement_rec( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * pFun )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    // prepare the leaves of the function
    for ( i = 0; i < (int)pFun->nVars; i++ )
    {
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        if ( !Abc_ObjIsComplement(pFanin) )
            Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)pFanin );
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( vLeaves, pFun->pFanins[i] );
        assert( Abc_ObjIsComplement(pFanin) );
    }
    // construct the function
    pRes = Lpk_ImplementFun( pMan, pNtk, vLeaves, pFun );
    // replace the function
    Vec_PtrWriteEntry( vLeaves, pFun->Id, Abc_ObjNot(pRes) );
    Lpk_FunFree( pFun );
    return pRes;
}